

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall SigningCertificate::SetDataSize(SigningCertificate *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = GetEncodedSize<ESSCertID>(&this->certs);
  sVar2 = GetEncodedSize<PolicyInformation>(&this->policies);
  (this->super_DerBase).cbData = sVar2 + sVar1;
  return sVar2 + sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
		return (cbData = GetEncodedSize(certs) + GetEncodedSize(policies));
	}